

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

uint32_t __thiscall bssl::ssl_hash_session_id(bssl *this,Span<const_unsigned_char> session_id)

{
  ulong in_RAX;
  uchar *__n;
  uint8_t tmp_storage [4];
  undefined8 uStack_18;
  
  __n = session_id.data_;
  uStack_18 = in_RAX;
  if (__n < &DAT_00000004) {
    uStack_18 = in_RAX & 0xffffffff;
    if (__n != (uchar *)0x0) {
      memcpy((void *)((long)&uStack_18 + 4),this,(size_t)__n);
    }
    this = (bssl *)((long)&uStack_18 + 4);
    __n = &DAT_00000004;
  }
  if ((((uchar *)0x1 < __n) && (__n != (uchar *)0x2)) && ((uchar *)0x3 < __n)) {
    return *(uint32_t *)this;
  }
  abort();
}

Assistant:

uint32_t ssl_hash_session_id(Span<const uint8_t> session_id) {
  // Take the first four bytes of |session_id|. Session IDs are generated by the
  // server randomly, so we can assume even using the first four bytes results
  // in a good distribution.
  uint8_t tmp_storage[sizeof(uint32_t)];
  if (session_id.size() < sizeof(tmp_storage)) {
    OPENSSL_memset(tmp_storage, 0, sizeof(tmp_storage));
    OPENSSL_memcpy(tmp_storage, session_id.data(), session_id.size());
    session_id = tmp_storage;
  }

  uint32_t hash = ((uint32_t)session_id[0]) | ((uint32_t)session_id[1] << 8) |
                  ((uint32_t)session_id[2] << 16) |
                  ((uint32_t)session_id[3] << 24);

  return hash;
}